

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

bool __thiscall
NJamSpell::TSpellCorrector::TrainLangModel
          (TSpellCorrector *this,string *textFile,string *alphabetFile,string *modelFile)

{
  bool bVar1;
  undefined1 local_40 [8];
  string cacheFile;
  
  bVar1 = TLangModel::Train(&this->LangModel,textFile,alphabetFile);
  if (bVar1) {
    PrepareCache(this);
    bVar1 = TLangModel::Dump(&this->LangModel,modelFile);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     modelFile,".spell");
      bVar1 = SaveCache(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
      std::__cxx11::string::~string((string *)local_40);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool TSpellCorrector::TrainLangModel(const std::string& textFile, const std::string& alphabetFile, const std::string& modelFile) {
    if (!LangModel.Train(textFile, alphabetFile)) {
        return false;
    }
    PrepareCache();
    if (!LangModel.Dump(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!SaveCache(cacheFile)) {
        return false;
    }
    return true;
}